

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
spirv_cross::SmallVector<spirv_cross::Meta::Decoration,_0UL>::reserve
          (SmallVector<spirv_cross::Meta::Decoration,_0UL> *this,size_t count)

{
  undefined8 *puVar1;
  Decoration *pDVar2;
  char *pcVar3;
  char *pcVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined8 uVar20;
  ulong uVar21;
  Decoration *pDVar22;
  char *pcVar23;
  undefined8 *puVar24;
  long lVar25;
  long *plVar26;
  long *plVar27;
  long lVar28;
  ulong uVar29;
  byte bVar30;
  
  bVar30 = 0;
  if (count < 0xb60b60b60b60b7) {
    uVar29 = this->buffer_capacity;
    if (uVar29 < count) {
      uVar29 = uVar29 + (uVar29 == 0);
      do {
        uVar21 = uVar29;
        uVar29 = uVar21 * 2;
      } while (uVar21 < count);
      if (uVar21 == 0) {
        pDVar22 = (Decoration *)0x0;
      }
      else {
        pDVar22 = (Decoration *)malloc(uVar21 * 0x168);
      }
      if (pDVar22 == (Decoration *)0x0) goto LAB_0022e4cb;
      if ((pDVar22 != (this->super_VectorView<spirv_cross::Meta::Decoration>).ptr) &&
         ((this->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size != 0)) {
        lVar28 = 0;
        uVar29 = 0;
        do {
          plVar27 = (long *)((long)&(pDVar22->alias)._M_dataplus._M_p + lVar28);
          pDVar2 = (this->super_VectorView<spirv_cross::Meta::Decoration>).ptr;
          puVar1 = (undefined8 *)((long)&(pDVar22->alias)._M_dataplus._M_p + lVar28);
          *puVar1 = puVar1 + 2;
          puVar24 = (undefined8 *)((long)&(pDVar2->alias)._M_dataplus._M_p + lVar28);
          plVar26 = puVar24 + 2;
          if (plVar26 == (long *)*puVar24) {
            uVar20 = puVar24[3];
            puVar1[2] = *plVar26;
            puVar1[3] = uVar20;
          }
          else {
            *plVar27 = (long)*puVar24;
            plVar27[2] = *plVar26;
          }
          puVar1 = (undefined8 *)((long)&(pDVar2->alias)._M_dataplus._M_p + lVar28);
          puVar24 = puVar1 + 6;
          pcVar4 = (pDVar22->qualified_alias).field_2._M_local_buf + lVar28;
          *(undefined8 *)(pcVar4 + -0x28) = puVar1[1];
          *puVar1 = plVar26;
          puVar1[1] = 0;
          *(undefined1 *)(puVar1 + 2) = 0;
          *(char **)(pcVar4 + -0x10) = pcVar4;
          if (puVar24 == (undefined8 *)puVar1[4]) {
            uVar20 = puVar1[7];
            *(undefined8 *)pcVar4 = *puVar24;
            *(undefined8 *)(pcVar4 + 8) = uVar20;
          }
          else {
            *(undefined8 **)((long)&(pDVar22->qualified_alias)._M_dataplus._M_p + lVar28) =
                 (undefined8 *)puVar1[4];
            *(undefined8 *)((long)&(pDVar22->qualified_alias).field_2 + lVar28) = *puVar24;
          }
          pcVar23 = (pDVar2->hlsl_semantic).field_2._M_local_buf + lVar28;
          pcVar4 = (pDVar22->hlsl_semantic).field_2._M_local_buf + lVar28;
          *(undefined8 *)(pcVar4 + -0x28) =
               *(undefined8 *)((long)&(pDVar2->qualified_alias)._M_string_length + lVar28);
          *(undefined8 **)((long)&(pDVar2->qualified_alias)._M_dataplus._M_p + lVar28) = puVar24;
          *(undefined8 *)((long)&(pDVar2->qualified_alias)._M_string_length + lVar28) = 0;
          (pDVar2->qualified_alias).field_2._M_local_buf[lVar28] = '\0';
          *(char **)(pcVar4 + -0x10) = pcVar4;
          pcVar3 = *(char **)((long)&(pDVar2->hlsl_semantic)._M_dataplus._M_p + lVar28);
          if (pcVar23 == pcVar3) {
            uVar20 = *(undefined8 *)((long)&(pDVar2->hlsl_semantic).field_2 + lVar28 + 8);
            *(undefined8 *)pcVar4 = *(undefined8 *)pcVar23;
            *(undefined8 *)(pcVar4 + 8) = uVar20;
          }
          else {
            *(char **)((long)&(pDVar22->hlsl_semantic)._M_dataplus._M_p + lVar28) = pcVar3;
            *(undefined8 *)((long)&(pDVar22->hlsl_semantic).field_2 + lVar28) =
                 *(undefined8 *)pcVar23;
          }
          lVar25 = (long)&(pDVar2->decoration_flags).higher._M_h._M_buckets + lVar28;
          *(undefined8 *)((long)&(pDVar22->hlsl_semantic)._M_string_length + lVar28) =
               *(undefined8 *)((long)&(pDVar2->hlsl_semantic)._M_string_length + lVar28);
          *(char **)((long)&(pDVar2->hlsl_semantic)._M_dataplus._M_p + lVar28) = pcVar23;
          *(undefined8 *)((long)&(pDVar2->hlsl_semantic)._M_string_length + lVar28) = 0;
          (pDVar2->hlsl_semantic).field_2._M_local_buf[lVar28] = '\0';
          *(undefined8 *)((long)&(pDVar22->decoration_flags).lower + lVar28) =
               *(undefined8 *)((long)&(pDVar2->decoration_flags).lower + lVar28);
          ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)((long)&(pDVar22->decoration_flags).higher._M_h._M_buckets + lVar28),
                       lVar25,lVar25);
          uVar5 = *(undefined4 *)((long)(pDVar2->extended).values + lVar28 + -0x80);
          uVar6 = *(undefined4 *)((long)(pDVar2->extended).values + lVar28 + -0x7c);
          uVar7 = *(undefined4 *)((long)(pDVar2->extended).values + lVar28 + -0x78);
          uVar8 = *(undefined4 *)((long)(pDVar2->extended).values + lVar28 + -0x74);
          uVar9 = *(undefined4 *)((long)(pDVar2->extended).values + lVar28 + -0x70);
          uVar10 = *(undefined4 *)((long)(pDVar2->extended).values + lVar28 + -0x6c);
          uVar11 = *(undefined4 *)((long)(pDVar2->extended).values + lVar28 + -0x68);
          uVar12 = *(undefined4 *)((long)(pDVar2->extended).values + lVar28 + -100);
          uVar13 = *(undefined4 *)((long)(pDVar2->extended).values + lVar28 + -0x60);
          uVar14 = *(undefined4 *)((long)(pDVar2->extended).values + lVar28 + -0x5c);
          uVar15 = *(undefined4 *)((long)(pDVar2->extended).values + lVar28 + -0x58);
          uVar16 = *(undefined4 *)((long)(pDVar2->extended).values + lVar28 + -0x54);
          uVar17 = *(undefined4 *)((long)(pDVar2->extended).values + lVar28 + -0x4f);
          uVar18 = *(undefined4 *)((long)(pDVar2->extended).values + lVar28 + -0x4b);
          uVar19 = *(undefined4 *)((long)(pDVar2->extended).values + lVar28 + -0x47);
          *(undefined4 *)((long)(pDVar22->extended).values + lVar28 + -0x53) =
               *(undefined4 *)((long)(pDVar2->extended).values + lVar28 + -0x53);
          *(undefined4 *)((long)(pDVar22->extended).values + lVar28 + -0x4f) = uVar17;
          *(undefined4 *)((long)(pDVar22->extended).values + lVar28 + -0x4b) = uVar18;
          *(undefined4 *)((long)(pDVar22->extended).values + lVar28 + -0x47) = uVar19;
          *(undefined4 *)((long)(pDVar22->extended).values + lVar28 + -0x60) = uVar13;
          *(undefined4 *)((long)(pDVar22->extended).values + lVar28 + -0x5c) = uVar14;
          *(undefined4 *)((long)(pDVar22->extended).values + lVar28 + -0x58) = uVar15;
          *(undefined4 *)((long)(pDVar22->extended).values + lVar28 + -0x54) = uVar16;
          *(undefined4 *)((long)(pDVar22->extended).values + lVar28 + -0x70) = uVar9;
          *(undefined4 *)((long)(pDVar22->extended).values + lVar28 + -0x6c) = uVar10;
          *(undefined4 *)((long)(pDVar22->extended).values + lVar28 + -0x68) = uVar11;
          *(undefined4 *)((long)(pDVar22->extended).values + lVar28 + -100) = uVar12;
          *(undefined4 *)((long)(pDVar22->extended).values + lVar28 + -0x80) = uVar5;
          *(undefined4 *)((long)(pDVar22->extended).values + lVar28 + -0x7c) = uVar6;
          *(undefined4 *)((long)(pDVar22->extended).values + lVar28 + -0x78) = uVar7;
          *(undefined4 *)((long)(pDVar22->extended).values + lVar28 + -0x74) = uVar8;
          *(undefined8 *)((long)(pDVar22->extended).values + lVar28 + -0x40) =
               *(undefined8 *)((long)(pDVar2->extended).values + lVar28 + -0x40);
          ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)(plVar27 + 0x1d),(long)(pDVar2->extended).values + lVar28 + -0x38);
          plVar26 = (long *)((long)(pDVar2->extended).values + lVar28);
          plVar27 = plVar27 + 0x24;
          for (lVar25 = 8; lVar25 != 0; lVar25 = lVar25 + -1) {
            *plVar27 = *plVar26;
            plVar26 = plVar26 + (ulong)bVar30 * -2 + 1;
            plVar27 = plVar27 + (ulong)bVar30 * -2 + 1;
          }
          *(undefined4 *)((long)(pDVar22->extended).values + lVar28 + 0x40) =
               *(undefined4 *)((long)(pDVar2->extended).values + lVar28 + 0x40);
          pDVar2 = (this->super_VectorView<spirv_cross::Meta::Decoration>).ptr;
          ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)((long)(pDVar2->extended).values + lVar28 + -0x38));
          ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)((long)&(pDVar2->decoration_flags).higher._M_h._M_buckets + lVar28));
          pcVar4 = *(char **)((long)&(pDVar2->hlsl_semantic)._M_dataplus._M_p + lVar28);
          if ((pDVar2->hlsl_semantic).field_2._M_local_buf + lVar28 != pcVar4) {
            operator_delete(pcVar4);
          }
          pcVar4 = *(char **)((long)&(pDVar2->qualified_alias)._M_dataplus._M_p + lVar28);
          if ((pDVar2->qualified_alias).field_2._M_local_buf + lVar28 != pcVar4) {
            operator_delete(pcVar4);
          }
          puVar1 = (undefined8 *)((long)&(pDVar2->alias)._M_dataplus._M_p + lVar28);
          puVar24 = (undefined8 *)*puVar1;
          if (puVar1 + 2 != puVar24) {
            operator_delete(puVar24);
          }
          uVar29 = uVar29 + 1;
          lVar28 = lVar28 + 0x168;
        } while (uVar29 < (this->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size);
      }
      pDVar2 = (this->super_VectorView<spirv_cross::Meta::Decoration>).ptr;
      if (pDVar2 != (Decoration *)0x0) {
        free(pDVar2);
      }
      (this->super_VectorView<spirv_cross::Meta::Decoration>).ptr = pDVar22;
      this->buffer_capacity = uVar21;
    }
    return;
  }
LAB_0022e4cb:
  ::std::terminate();
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > (std::numeric_limits<size_t>::max)() / sizeof(T)) ||
		    (count > (std::numeric_limits<size_t>::max)() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}